

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::enforceNoDuplicateTestCases
               (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions)

{
  bool bVar1;
  reference __x;
  ostream *poVar2;
  pointer pTVar3;
  pointer this;
  TestCaseInfo *pTVar4;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar5;
  Colour local_81;
  _Base_ptr local_80;
  undefined1 local_78;
  _Rb_tree_const_iterator<Catch::TestCase> local_60;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> prev;
  const_iterator itEnd;
  const_iterator it;
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> seenFunctions;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions_local;
  
  std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::set
            ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
             &it);
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(functions);
  prev._8_8_ = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&itEnd,(__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                               *)&prev.second);
    if (!bVar1) {
      std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::~set
                ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                  *)&it);
      return;
    }
    __x = __gnu_cxx::
          __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
          ::operator*(&itEnd);
    pVar5 = std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
            ::insert((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                      *)&it,__x);
    local_80 = (_Base_ptr)pVar5.first._M_node;
    local_78 = pVar5.second;
    local_60._M_node = local_80;
    prev.first._M_node._0_1_ = local_78;
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  }
  poVar2 = cerr();
  Colour::Colour(&local_81,Red);
  poVar2 = operator<<(poVar2,&local_81);
  poVar2 = std::operator<<(poVar2,"error: TEST_CASE( \"");
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator->(&itEnd);
  poVar2 = std::operator<<(poVar2,(string *)pTVar3);
  poVar2 = std::operator<<(poVar2,"\" ) already defined.\n");
  poVar2 = std::operator<<(poVar2,"\tFirst seen at ");
  this = std::_Rb_tree_const_iterator<Catch::TestCase>::operator->(&local_60);
  pTVar4 = TestCase::getTestCaseInfo(this);
  poVar2 = operator<<(poVar2,&pTVar4->lineInfo);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tRedefined at ");
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator->(&itEnd);
  pTVar4 = TestCase::getTestCaseInfo(pTVar3);
  poVar2 = operator<<(poVar2,&pTVar4->lineInfo);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Colour::~Colour(&local_81);
  exit(1);
}

Assistant:

void enforceNoDuplicateTestCases( std::vector<TestCase> const& functions ) {
        std::set<TestCase> seenFunctions;
        for( std::vector<TestCase>::const_iterator it = functions.begin(), itEnd = functions.end();
            it != itEnd;
            ++it ) {
            std::pair<std::set<TestCase>::const_iterator, bool> prev = seenFunctions.insert( *it );
            if( !prev.second ){
                Catch::cerr()
                << Colour( Colour::Red )
                << "error: TEST_CASE( \"" << it->name << "\" ) already defined.\n"
                << "\tFirst seen at " << prev.first->getTestCaseInfo().lineInfo << "\n"
                << "\tRedefined at " << it->getTestCaseInfo().lineInfo << std::endl;
                exit(1);
            }
        }
    }